

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O3

void __thiscall
directed_graph_t::directed_graph_t
          (directed_graph_t *this,vertex_index_t _number_of_vertices,bool directed,
          float density_hint)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  float fVar2;
  value_type_conflict3 local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  float local_48;
  
  this->number_of_vertices = _number_of_vertices;
  local_58 = &this->edges;
  local_50 = &this->outdegrees;
  (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->directed = directed;
  uVar1 = CONCAT62(in_register_00000032,_number_of_vertices) & 0xffffffff;
  (this->incidence_incoming).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->incidence_incoming).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->incidence_incoming).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->incidence_outgoing).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->incidence_outgoing).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->incidence_outgoing).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->incidence_row_length =
       (ulong)(((uint)(CONCAT62(in_register_00000032,_number_of_vertices) >> 6) & 0x3ffffff) + 1);
  local_60 = 0;
  local_48 = density_hint;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_50,uVar1,&local_60);
  local_60 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->indegrees,uVar1,&local_60);
  local_60 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->incidence_incoming,this->incidence_row_length * uVar1,&local_60);
  local_60 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->incidence_outgoing,uVar1 * this->incidence_row_length,&local_60);
  fVar2 = local_48 * (float)_number_of_vertices * (float)_number_of_vertices;
  fVar2 = fVar2 + fVar2;
  uVar1 = (ulong)fVar2;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (local_58,(long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1);
  return;
}

Assistant:

directed_graph_t(vertex_index_t _number_of_vertices, bool directed = true, float density_hint = 0.01)
	    : number_of_vertices(_number_of_vertices), directed(directed),
	      incidence_row_length((_number_of_vertices >> 6) + 1) {
		outdegrees.resize(_number_of_vertices, 0);
		indegrees.resize(_number_of_vertices, 0);
		incidence_incoming.resize(incidence_row_length * _number_of_vertices, 0);
		incidence_outgoing.resize(incidence_row_length * _number_of_vertices, 0);

		size_t vertex_number = (size_t)_number_of_vertices;
		edges.reserve(size_t(vertex_number * density_hint * vertex_number * 2));
	}